

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

uint ** Extra_TruthPerm63(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint **ppuVar3;
  uint **ppuVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  uint uTruth [2];
  uint local_30;
  uint local_2c;
  
  ppuVar3 = (uint **)malloc(0x20800);
  ppuVar4 = ppuVar3 + 0x100;
  *ppuVar3 = (uint *)ppuVar4;
  auVar2 = _DAT_0093d220;
  auVar1 = _DAT_0093d210;
  lVar6 = 1;
  lVar7 = 2;
  lVar5 = 0;
  do {
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar8 = (auVar8 | auVar1) ^ auVar2;
    if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7fffff01) {
      ppuVar3[lVar5 + 1] = (uint *)(ppuVar4 + lVar6 * 0x40);
      ppuVar3[lVar5 + 2] = (uint *)(ppuVar4 + lVar7 * 0x40);
    }
    lVar5 = lVar5 + 2;
    lVar6 = lVar6 + 2;
    lVar7 = lVar7 + 2;
  } while (lVar5 != 0x100);
  lVar5 = 0;
  do {
    local_30 = (int)lVar5 * 0x1010101;
    lVar6 = 0;
    lVar7 = 0;
    local_2c = local_30;
    do {
      Extra_TruthPerm6One(&local_30,(int)lVar7,(uint *)((long)ppuVar3[lVar5] + lVar6));
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 4;
    } while (lVar7 != 0x40);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  return ppuVar3;
}

Assistant:

void ** Extra_ArrayAlloc( int nCols, int nRows, int Size )
{
    void ** pRes;
    char * pBuffer;
    int i;
    assert( nCols > 0 && nRows > 0 && Size > 0 );
    pBuffer = ABC_ALLOC( char, nCols * (sizeof(void *) + nRows * Size) );
    pRes = (void **)pBuffer;
    pRes[0] = pBuffer + nCols * sizeof(void *);
    for ( i = 1; i < nCols; i++ )
        pRes[i] = (void *)((char *)pRes[0] + i * nRows * Size);
    return pRes;
}